

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O0

err_t bignPubkeyCalc(octet *pubkey,bign_params *params,octet *privkey)

{
  size_t n_00;
  bool_t bVar1;
  int iVar2;
  long *plVar3;
  word *a;
  word *pwVar4;
  void *in_RDX;
  bign_deep_i in_RSI;
  word *in_RDI;
  word *unaff_retaddr;
  void *stack;
  word *Q;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  void *in_stack_ffffffffffffff98;
  bign_params *in_stack_ffffffffffffffa0;
  u64 *dest;
  bign_params *in_stack_ffffffffffffffd0;
  size_t count;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar5;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    eVar5 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffffa0);
    if (bVar1 == 0) {
      eVar5 = 0x1f6;
    }
    else {
      bignStart_keep((size_t)in_RDI,in_RSI);
      plVar3 = (long *)blobCreate((size_t)in_stack_ffffffffffffff98);
      if (plVar3 == (long *)0x0) {
        eVar5 = 0x6e;
      }
      else {
        eVar5 = bignStart((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffd0);
        if (eVar5 == 0) {
          count = *(size_t *)(plVar3[3] + 0x38);
          n_00 = *(size_t *)(plVar3[3] + 0x30);
          bVar1 = memIsValid(in_RDX,count);
          if ((bVar1 != 0) && (bVar1 = memIsValid(in_RDI,count << 1), bVar1 != 0)) {
            a = (word *)((long)plVar3 + *plVar3);
            pwVar4 = a + n_00;
            dest = pwVar4 + n_00 * 2;
            u64From(dest,in_stack_ffffffffffffff98,0x14537c);
            bVar1 = wwIsZero(a,n_00);
            if ((bVar1 == 0) && (iVar2 = wwCmp(a,(word *)plVar3[7],n_00), iVar2 < 0)) {
              bVar1 = ecMulA((word *)stack,unaff_retaddr,
                             (ec_o *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI,(size_t)in_RSI,in_RDX);
              if (bVar1 == 0) {
                eVar5 = 0x1f6;
              }
              else {
                (**(code **)(plVar3[3] + 0x48))(in_RDI,pwVar4,plVar3[3],dest);
                (**(code **)(plVar3[3] + 0x48))((long)in_RDI + count,pwVar4 + n_00,plVar3[3],dest);
              }
              blobClose((blob_t)0x145463);
              return eVar5;
            }
            blobClose((blob_t)0x1453b7);
            return 0x1f8;
          }
          blobClose((blob_t)0x14531a);
          eVar5 = 0x6d;
        }
        else {
          blobClose((blob_t)0x1452aa);
        }
      }
    }
  }
  return eVar5;
}

Assistant:

err_t bignPubkeyCalc(octet pubkey[], const bign_params* params,
	const octet privkey[])
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignPubkeyCalc_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, no) || !memIsValid(pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// загрузить d
	wwFrom(d, privkey, no);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// выгрузить открытый ключ
		qrTo(pubkey, ecX(Q), ec->f, stack);
		qrTo(pubkey + no, ecY(Q, n), ec->f, stack);
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}